

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib525.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  int iVar1;
  FILE *__stream;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  undefined8 uVar6;
  char *pcVar7;
  long lVar8;
  timeval tVar9;
  undefined8 uStack_260;
  int maxfd;
  int running;
  timeval interval;
  fd_set wr;
  fd_set rd;
  fd_set exc;
  stat file_info;
  
  tv_test_start = tutil_tvnow();
  if (libtest_arg2 == (char *)0x0) {
    curl_mfprintf(_stderr,"Usage: lib525 [url] [uploadfile]\n");
    iVar1 = 0x76;
    goto LAB_00102626;
  }
  __stream = fopen64(libtest_arg2,"rb");
  uVar6 = _stderr;
  if (__stream == (FILE *)0x0) {
    piVar5 = __errno_location();
    iVar1 = *piVar5;
    pcVar7 = strerror(iVar1);
    curl_mfprintf(uVar6,"fopen failed with error: %d (%s)\n",iVar1,pcVar7);
    curl_mfprintf(_stderr,"Error opening file: (%s)\n",libtest_arg2);
    iVar1 = 0x75;
    goto LAB_00102626;
  }
  iVar1 = fileno(__stream);
  iVar1 = fstat64(iVar1,(stat64 *)&file_info);
  uVar6 = _stderr;
  if (iVar1 == -1) {
    piVar5 = __errno_location();
    iVar1 = *piVar5;
    pcVar7 = strerror(iVar1);
    curl_mfprintf(uVar6,"fstat() failed with error: %d (%s)\n",iVar1,pcVar7);
    curl_mfprintf(_stderr,"ERROR: cannot open file (%s)\n",libtest_arg2);
    fclose(__stream);
    iVar1 = 0x74;
    goto LAB_00102626;
  }
  iVar1 = curl_global_init(3);
  uVar6 = _stderr;
  if (iVar1 == 0) {
    lVar3 = curl_easy_init();
    if (lVar3 == 0) {
      lVar8 = 0;
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib525.c"
                    ,0x50);
      iVar1 = 0x7c;
      goto LAB_001025fe;
    }
    iVar1 = curl_easy_setopt(lVar3,0x2e,1);
    uVar6 = _stderr;
    if (iVar1 == 0) {
      iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
      uVar6 = _stderr;
      if (iVar1 != 0) {
        uVar2 = curl_easy_strerror(iVar1);
        pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        lVar8 = 0;
        uStack_260 = 0x56;
        goto LAB_001025f1;
      }
      iVar1 = curl_easy_setopt(lVar3,0x29,1);
      uVar6 = _stderr;
      if (iVar1 != 0) {
        uVar2 = curl_easy_strerror(iVar1);
        pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        lVar8 = 0;
        uStack_260 = 0x59;
        goto LAB_001025f1;
      }
      iVar1 = curl_easy_setopt(lVar3,0x2721,"-");
      uVar6 = _stderr;
      if (iVar1 != 0) {
        uVar2 = curl_easy_strerror(iVar1);
        pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        lVar8 = 0;
        uStack_260 = 0x5c;
        goto LAB_001025f1;
      }
      iVar1 = curl_easy_setopt(lVar3,0x2719,__stream);
      uVar6 = _stderr;
      if (iVar1 != 0) {
        uVar2 = curl_easy_strerror(iVar1);
        pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        lVar8 = 0;
        uStack_260 = 0x5f;
        goto LAB_001025f1;
      }
      iVar1 = curl_easy_setopt(lVar3,0x75a3,file_info.st_size);
      uVar6 = _stderr;
      if (iVar1 != 0) {
        uVar2 = curl_easy_strerror(iVar1);
        pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        lVar8 = 0;
        uStack_260 = 0x6a;
        goto LAB_001025f1;
      }
      lVar8 = curl_multi_init();
      if (lVar8 == 0) {
        lVar8 = 0;
        curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib525.c"
                      ,0x6c);
        iVar1 = 0x7b;
      }
      else {
        iVar1 = curl_multi_add_handle(lVar8,lVar3);
        uVar6 = _stderr;
        if (iVar1 != 0) {
          uVar2 = curl_multi_strerror(iVar1);
          pcVar7 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
          uStack_260 = 0x6e;
          goto LAB_001025f1;
        }
        do {
          maxfd = -99;
          interval.tv_sec = 1;
          interval.tv_usec = 0;
          iVar1 = curl_multi_perform(lVar8,&running);
          uVar6 = _stderr;
          if (iVar1 != 0) {
            uVar2 = curl_multi_strerror(iVar1);
            pcVar7 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
            uStack_260 = 0x78;
            goto LAB_001025f1;
          }
          if (running < 0) {
            pcVar7 = 
            "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
            ;
            uVar6 = 0x78;
LAB_001028be:
            curl_mfprintf(_stderr,pcVar7,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib525.c"
                          ,uVar6);
            iVar1 = 0x7a;
            goto LAB_001025fe;
          }
          tVar9 = tutil_tvnow();
          lVar4 = tutil_tvdiff(tVar9,tv_test_start);
          if (60000 < lVar4) {
            uVar6 = 0x7a;
            goto LAB_0010285e;
          }
          if (running == 0) {
            iVar1 = 0;
            goto LAB_001025fe;
          }
          for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
            rd.__fds_bits[lVar4] = 0;
          }
          for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
            wr.__fds_bits[lVar4] = 0;
          }
          for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
            exc.__fds_bits[lVar4] = 0;
          }
          iVar1 = curl_multi_fdset(lVar8,&rd,&wr,&exc,&maxfd);
          uVar6 = _stderr;
          if (iVar1 != 0) {
            uVar2 = curl_multi_strerror(iVar1);
            pcVar7 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
            uStack_260 = 0x83;
            goto LAB_001025f1;
          }
          if (maxfd < -1) {
            pcVar7 = "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
            uVar6 = 0x83;
            goto LAB_001028be;
          }
          iVar1 = select_wrapper(maxfd + 1,&rd,&wr,&exc,&interval);
          if (iVar1 == -1) {
            piVar5 = __errno_location();
            uVar6 = _stderr;
            iVar1 = *piVar5;
            pcVar7 = strerror(iVar1);
            curl_mfprintf(uVar6,"%s:%d select() failed, with errno %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib525.c"
                          ,0x87,iVar1,pcVar7);
            iVar1 = 0x79;
            goto LAB_001025fe;
          }
          tVar9 = tutil_tvnow();
          lVar4 = tutil_tvdiff(tVar9,tv_test_start);
        } while (lVar4 < 0xea61);
        uVar6 = 0x89;
LAB_0010285e:
        curl_mfprintf(_stderr,
                      "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib525.c"
                      ,uVar6);
        iVar1 = 0x7d;
      }
    }
    else {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar8 = 0;
      uStack_260 = 0x53;
LAB_001025f1:
      curl_mfprintf(uVar6,pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib525.c"
                    ,uStack_260,iVar1,uVar2);
    }
LAB_001025fe:
    curl_multi_remove_handle(lVar8,lVar3);
    curl_easy_cleanup(lVar3);
    curl_multi_cleanup(lVar8);
    curl_global_cleanup();
  }
  else {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar6,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib525.c"
                  ,0x4a,iVar1,uVar2);
  }
  fclose(__stream);
LAB_00102626:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl = NULL;
  FILE *hd_src = NULL;
  int hd;
  struct_stat file_info;
  CURLM *m = NULL;
  int running;

  start_test_timing();

  if(!libtest_arg2) {
#ifdef LIB529
    /* test 529 */
    fprintf(stderr, "Usage: lib529 [url] [uploadfile]\n");
#else
    /* test 525 */
    fprintf(stderr, "Usage: lib525 [url] [uploadfile]\n");
#endif
    return TEST_ERR_USAGE;
  }

  hd_src = fopen(libtest_arg2, "rb");
  if(NULL == hd_src) {
    fprintf(stderr, "fopen failed with error: %d (%s)\n",
            errno, strerror(errno));
    fprintf(stderr, "Error opening file: (%s)\n", libtest_arg2);
    return TEST_ERR_FOPEN;
  }

  /* get the file size of the local file */
  hd = fstat(fileno(hd_src), &file_info);
  if(hd == -1) {
    /* can't open file, bail out */
    fprintf(stderr, "fstat() failed with error: %d (%s)\n",
            errno, strerror(errno));
    fprintf(stderr, "ERROR: cannot open file (%s)\n", libtest_arg2);
    fclose(hd_src);
    return TEST_ERR_FSTAT;
  }

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    fclose(hd_src);
    return res;
  }

  easy_init(curl);

  /* enable uploading */
  easy_setopt(curl, CURLOPT_UPLOAD, 1L);

  /* specify target */
  easy_setopt(curl, CURLOPT_URL, URL);

  /* go verbose */
  easy_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* use active FTP */
  easy_setopt(curl, CURLOPT_FTPPORT, "-");

  /* now specify which file to upload */
  easy_setopt(curl, CURLOPT_READDATA, hd_src);

  /* NOTE: if you want this code to work on Windows with libcurl as a DLL, you
     MUST also provide a read callback with CURLOPT_READFUNCTION. Failing to
     do so will give you a crash since a DLL may not use the variable's memory
     when passed in to it from an app like this. */

  /* Set the size of the file to upload (optional).  If you give a *_LARGE
     option you MUST make sure that the type of the passed-in argument is a
     curl_off_t. If you use CURLOPT_INFILESIZE (without _LARGE) you must
     make sure that to pass in a type 'long' argument. */
  easy_setopt(curl, CURLOPT_INFILESIZE_LARGE, (curl_off_t)file_info.st_size);

  multi_init(m);

  multi_add_handle(m, curl);

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

#ifdef LIB529
  /* test 529 */
  /* proper cleanup sequence - type PA */
  curl_multi_remove_handle(m, curl);
  curl_multi_cleanup(m);
  curl_easy_cleanup(curl);
  curl_global_cleanup();
#else
  /* test 525 */
  /* proper cleanup sequence - type PB */
  curl_multi_remove_handle(m, curl);
  curl_easy_cleanup(curl);
  curl_multi_cleanup(m);
  curl_global_cleanup();
#endif

  /* close the local file */
  fclose(hd_src);

  return res;
}